

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O1

bool __thiscall World::PlayerOnline(World *this,string *username)

{
  ulong uVar1;
  char cVar2;
  pointer pcVar3;
  EOServer *pEVar4;
  _List_node_base *p_Var5;
  int iVar6;
  ulong uVar7;
  _List_node_base *p_Var8;
  bool bVar9;
  long *local_48;
  ulong local_40;
  long local_38 [2];
  
  pcVar3 = (username->_M_dataplus)._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar3,pcVar3 + username->_M_string_length);
  bVar9 = local_40 == 0;
  if (!bVar9) {
    cVar2 = (char)*local_48;
    if ((((byte)(cVar2 - 0x30U) < 10) || (cVar2 == ' ')) || ((byte)(cVar2 + 0x9fU) < 0x1a)) {
      uVar1 = 1;
      do {
        uVar7 = uVar1;
        if (local_40 == uVar7) break;
        cVar2 = *(char *)((long)local_48 + uVar7);
        uVar1 = uVar7 + 1;
      } while ((((byte)(cVar2 - 0x30U) < 10) || (cVar2 == ' ')) || ((byte)(cVar2 + 0x9fU) < 0x1a));
      bVar9 = local_40 <= uVar7;
    }
    else {
      bVar9 = false;
    }
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  if (bVar9) {
    pEVar4 = this->server;
    for (p_Var8 = (pEVar4->super_Server).clients.
                  super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
                  super__List_node_base._M_next;
        bVar9 = p_Var8 != (_List_node_base *)&(pEVar4->super_Server).clients, bVar9;
        p_Var8 = p_Var8->_M_next) {
      p_Var5 = *(_List_node_base **)((long)(p_Var8[1]._M_next + 0x10) + 8);
      if ((p_Var5 != (_List_node_base *)0x0) &&
         (iVar6 = std::__cxx11::string::compare((string *)(p_Var5 + 1)), iVar6 == 0)) {
        return bVar9;
      }
    }
  }
  else {
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool World::PlayerOnline(std::string username)
{
	if (!Player::ValidName(username))
	{
		return false;
	}

	UTIL_FOREACH(this->server->clients, client)
	{
		EOClient *eoclient = static_cast<EOClient *>(client);

		if (eoclient->player)
		{
			if (eoclient->player->username.compare(username) == 0)
			{
				return true;
			}
		}
	}

	return false;
}